

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.h
# Opt level: O2

void __thiscall BailOutRecord::Fixup(BailOutRecord *this,DataChunk *chunkList)

{
  NativeCodeData::AddFixupEntry(this->globalBailOutRecordTable,this,this,chunkList);
  NativeCodeData::AddFixupEntry(this->argOutOffsetInfo,&this->argOutOffsetInfo,this,chunkList);
  NativeCodeData::AddFixupEntry(this->parent,&this->parent,this,chunkList);
  NativeCodeData::AddFixupEntry(this->constants,&this->constants,this,chunkList);
  NativeCodeData::AddFixupEntry(this->ehBailoutData,&this->ehBailoutData,this,chunkList);
  NativeCodeData::AddFixupEntry
            (this->stackLiteralBailOutRecord,&this->stackLiteralBailOutRecord,this,chunkList);
  return;
}

Assistant:

void Fixup(NativeCodeData::DataChunk* chunkList)
    {
        FixupNativeDataPointer(globalBailOutRecordTable, chunkList);
        FixupNativeDataPointer(argOutOffsetInfo, chunkList);
        FixupNativeDataPointer(parent, chunkList);
        FixupNativeDataPointer(constants, chunkList);
        FixupNativeDataPointer(ehBailoutData, chunkList);
        FixupNativeDataPointer(stackLiteralBailOutRecord, chunkList);
#ifdef _M_IX86
        // special handling for startCallOutParamCounts and outParamOffsets, becuase it points to middle of the allocation
        if (argOutOffsetInfo)
        {
            uint* startCallArgRestoreAdjustCountsStart = startCallArgRestoreAdjustCounts - argOutOffsetInfo->startCallIndex;
            NativeCodeData::AddFixupEntry(startCallArgRestoreAdjustCounts, startCallArgRestoreAdjustCountsStart, &this->startCallArgRestoreAdjustCounts, this, chunkList);
        }
#endif
    }